

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDivBound.cpp
# Opt level: O0

void TPZShapeHDivBound<pzshape::TPZShapePoint>::Initialize
               (TPZVec<long> *ids,int connectorder,int sideorient,TPZShapeData *data)

{
  int *piVar1;
  long in_RCX;
  int in_EDX;
  int in_ESI;
  int connectOrdersSize;
  int nsides;
  int ncorner;
  int *in_stack_00000028;
  TPZVec<int> *in_stack_00000030;
  TPZShapeData *in_stack_00000100;
  TPZVec<int> *in_stack_00000108;
  TPZVec<long> *in_stack_00000110;
  
  TPZManVector<int,_20>::Resize((TPZManVector<int,_20> *)data,_nsides);
  piVar1 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RCX + 0x2c70),0);
  *piVar1 = in_EDX;
  TPZManVector<int,_27>::Resize
            ((TPZManVector<int,_27> *)ids,CONCAT44(connectorder,sideorient),(int *)data);
  TPZVec<int>::Fill(in_stack_00000030,in_stack_00000028,(int64_t)ids,
                    CONCAT44(connectorder,sideorient));
  if (0 < in_ESI) {
    TPZShapeH1<pzshape::TPZShapePoint>::Initialize
              (in_stack_00000110,in_stack_00000108,in_stack_00000100);
  }
  return;
}

Assistant:

void TPZShapeHDivBound<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                           int connectorder, int sideorient,
                                           TPZShapeData &data) {
    const int ncorner = TSHAPE::NCornerNodes;
    const int nsides = TSHAPE::NSides;
#ifdef PZDEBUG
    if(ids.size() != ncorner || connectorder < 0 || std::abs(sideorient) != 1)
    {
        DebugStop();
    }
#endif
    data.fSideOrient.Resize(1);
    data.fSideOrient[0] = sideorient;
    int connectOrdersSize = nsides-ncorner;
    if (TSHAPE::Type() == EPoint){
        connectOrdersSize = 1;
    }
    data.fH1ConnectOrders.Resize(connectOrdersSize, connectorder);
    data.fH1ConnectOrders.Fill(connectorder);
    if(connectorder > 0)
    {
        TPZShapeH1<TSHAPE>::Initialize(ids,data.fH1ConnectOrders,data);
    }
}